

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int tremove(lua_State *L)

{
  int iVar1;
  size_t sVar2;
  lua_Integer lVar3;
  lua_State *in_RDI;
  int pos;
  int e;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  int iVar4;
  
  luaL_checktype(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  sVar2 = lua_objlen(L,e);
  iVar4 = (int)sVar2;
  lVar3 = luaL_optinteger((lua_State *)CONCAT44(e,pos),in_stack_fffffffffffffffc,(lua_Integer)in_RDI
                         );
  iVar1 = (int)lVar3;
  if ((iVar1 < 1) || (iVar4 < iVar1)) {
    iVar4 = 0;
  }
  else {
    lua_rawgeti((lua_State *)CONCAT44(e,pos),in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
    for (; iVar1 < iVar4; iVar1 = iVar1 + 1) {
      lua_rawgeti((lua_State *)CONCAT44(e,pos),in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
      lua_rawseti((lua_State *)CONCAT44(e,pos),in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
    }
    lua_pushnil(in_RDI);
    lua_rawseti((lua_State *)CONCAT44(e,pos),in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int tremove(lua_State*L){
int e=aux_getn(L,1);
int pos=luaL_optint(L,2,e);
if(!(1<=pos&&pos<=e))
return 0;
luaL_setn(L,1,e-1);
lua_rawgeti(L,1,pos);
for(;pos<e;pos++){
lua_rawgeti(L,1,pos+1);
lua_rawseti(L,1,pos);
}
lua_pushnil(L);
lua_rawseti(L,1,e);
return 1;
}